

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O3

ErrorNumber callAndProfile(char *funcName,ProfilingType type)

{
  TA_Real *value;
  int *piVar1;
  TA_Integer TVar2;
  TA_InputParameterType TVar3;
  TA_RetCode TVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  clock_t cVar8;
  clock_t cVar9;
  TA_Real *high;
  TA_Real *open;
  ErrorNumber EVar10;
  uint uVar11;
  int (*paiVar12) [2000];
  char *__s;
  TA_Real *low;
  TA_Real *close;
  TA_Real *volume;
  ulong uVar13;
  double (*padVar14) [2000];
  long lVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  TA_ParamHolder *paramHolder;
  uint local_98;
  int local_94;
  TA_FuncHandle *handle;
  TA_FuncInfo *funcInfo;
  int local_7c;
  int local_78;
  TA_Integer local_74;
  ulong local_70;
  long local_68;
  double local_60;
  double local_58;
  double *local_50;
  TA_OutputParameterInfo *outputInfo;
  TA_InputParameterInfo *inputInfo;
  int outNbElement;
  int outBegIdx;
  
  lVar7 = (long)(int)type;
  uVar11 = *(uint *)(&DAT_00188700 + lVar7 * 4);
  iVar6 = *(int *)(&DAT_0018871c + lVar7 * 4);
  lVar15 = *(long *)(&DAT_00188738 + lVar7 * 8);
  TVar2 = *(TA_Integer *)(&DAT_00188770 + lVar7 * 4);
  TVar4 = TA_GetFuncHandle(funcName,&handle);
  if (TVar4 == TA_SUCCESS) {
    TVar4 = TA_ParamHolderAlloc(handle,&paramHolder);
    if (TVar4 == TA_SUCCESS) {
      local_94 = iVar6;
      local_74 = TVar2;
      local_70 = (ulong)uVar11;
      local_68 = lVar15;
      TA_GetFuncInfo(handle,&funcInfo);
      if (0 < (int)funcInfo->nbOutput) {
        lVar15 = 0;
        padVar14 = output;
        paiVar12 = output_int;
        do {
          uVar11 = (uint)lVar15;
          TA_GetOutputParameterInfo(handle,uVar11,&outputInfo);
          if (outputInfo->type == TA_Output_Integer) {
            TA_SetOutputParamIntegerPtr(paramHolder,uVar11,output_int[lVar15]);
            lVar7 = 0;
            do {
              piVar1 = *paiVar12 + lVar7;
              piVar1[0] = -0x7fffffff;
              piVar1[1] = -0x7fffffff;
              piVar1[2] = -0x7fffffff;
              piVar1[3] = -0x7fffffff;
              lVar7 = lVar7 + 4;
            } while (lVar7 != 2000);
          }
          else if (outputInfo->type == TA_Output_Real) {
            TA_SetOutputParamRealPtr(paramHolder,uVar11,output[lVar15]);
            lVar7 = 0;
            do {
              (*padVar14)[lVar7] = -3e+37;
              (*padVar14 + lVar7)[1] = -3e+37;
              lVar7 = lVar7 + 2;
            } while (lVar7 != 2000);
          }
          lVar15 = lVar15 + 1;
          paiVar12 = paiVar12 + 1;
          padVar14 = padVar14 + 1;
        } while (lVar15 < (int)funcInfo->nbOutput);
      }
      local_7c = (int)local_70 * local_94 * 2 + -1;
      local_98 = (uint)CONCAT71((uint7)(uint3)((uint)local_7c >> 8),1);
      dVar18 = 0.0;
      dVar16 = 0.0;
      do {
        iVar6 = 0;
        do {
          uVar13 = 0;
          local_78 = iVar6;
          do {
            local_60 = dVar18;
            local_58 = dVar16;
            if (0 < (int)funcInfo->nbInput) {
              lVar15 = uVar13 * local_68;
              value = gDataClose + lVar15;
              local_50 = gDataOpen + lVar15;
              uVar11 = 0;
              do {
                TA_GetInputParameterInfo(handle,uVar11,&inputInfo);
                TVar3 = inputInfo->type;
                if (TVar3 == TA_Input_Price) {
                  uVar5 = inputInfo->flags;
                  open = (TA_Real *)0x0;
                  if ((uVar5 & 1) != 0) {
                    open = local_50;
                  }
                  auVar17._0_4_ = -(uint)((uVar5 & 0x10) == 0);
                  auVar17._4_4_ = -(uint)((uVar5 & 8) == 0);
                  auVar17._8_4_ = -(uint)((uVar5 & 4) == 0);
                  auVar17._12_4_ = -(uint)((uVar5 & 2) == 0);
                  uVar5 = movmskps(uVar5,auVar17);
                  high = (TA_Real *)0x0;
                  if ((uVar5 & 8) == 0) {
                    high = gDataHigh + lVar15;
                  }
                  low = (TA_Real *)0x0;
                  if ((uVar5 & 4) == 0) {
                    low = gDataLow + lVar15;
                  }
                  close = (TA_Real *)0x0;
                  if ((uVar5 & 2) == 0) {
                    close = value;
                  }
                  volume = (TA_Real *)0x0;
                  if ((uVar5 & 1) == 0) {
                    volume = value;
                  }
                  TA_SetInputParamPricePtr
                            (paramHolder,uVar11,open,high,low,close,volume,(TA_Real *)0x0);
                }
                else if (TVar3 == TA_Input_Real) {
                  TA_SetInputParamRealPtr(paramHolder,uVar11,value);
                }
                else if (TVar3 == TA_Input_Integer) {
                  __s = "\nError: Integer input not yet supported for profiling.";
                  goto LAB_0011ec36;
                }
                uVar11 = uVar11 + 1;
              } while ((int)uVar11 < (int)funcInfo->nbInput);
            }
            cVar8 = clock();
            TVar4 = TA_CallFunc(paramHolder,0,local_74,&outBegIdx,&outNbElement);
            if (TVar4 != TA_SUCCESS) {
              printf("TA_CallFunc() failed zero data test [%d]\n",(ulong)TVar4);
              TA_ParamHolderFree(paramHolder);
              return TA_ABS_TST_FAIL_CALLFUNC_1;
            }
            cVar9 = clock();
            if (cVar9 - cVar8 < 1) {
              __s = "Error: Insufficient timer precision to perform benchmarking on this platform.";
LAB_0011ec36:
              puts(__s);
              return TA_ABS_TST_FAIL_CALLFUNC_1;
            }
            dVar18 = (double)(cVar9 - cVar8);
            if (worstProfiledCall < dVar18) {
              worstProfiledCall = dVar18;
            }
            timeInProfiledCall = timeInProfiledCall + dVar18;
            nbProfiledCall = nbProfiledCall + 1;
            dVar16 = local_58 + dVar18;
            if (dVar18 <= local_60) {
              dVar18 = local_60;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != local_70);
          iVar6 = local_78 + 1;
        } while (iVar6 != local_94);
        EVar10 = TA_TEST_PASS;
        uVar11 = local_98 & 1;
        local_98 = 0;
      } while (uVar11 != 0);
      printf("%g ",(dVar16 - dVar18) / (double)local_7c);
      TVar4 = TA_ParamHolderFree(paramHolder);
      if (TVar4 != TA_SUCCESS) {
        printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar4);
        EVar10 = TA_ABS_TST_FAIL_PARAMHOLDERFREE;
      }
    }
    else {
      printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar4);
      EVar10 = TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
    }
  }
  else {
    printf("Can\'t get the function handle [%d]\n",(ulong)TVar4);
    EVar10 = TA_ABS_TST_FAIL_GETFUNCHANDLE;
  }
  return EVar10;
}

Assistant:

static ErrorNumber callAndProfile( const char *funcName, ProfilingType type )
{
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   const TA_FuncInfo *funcInfo;
   const TA_InputParameterInfo *inputInfo;
   const TA_OutputParameterInfo *outputInfo;

   TA_RetCode retCode;
   int h, i, j, k;
   int outBegIdx, outNbElement;

   /* Variables to control iteration and corresponding input size */
   int nbInnerLoop, nbOuterLoop;
   int stepSize;
   int inputSize;

   /* Variables measuring the execution time */
#ifdef WIN32
   LARGE_INTEGER startClock;
   LARGE_INTEGER endClock;
#else
   clock_t startClock;
   clock_t endClock;
#endif
   double clockDelta;
   int nbProfiledCallLocal;
   double timeInProfiledCallLocal;
   double worstProfiledCallLocal;

   nbProfiledCallLocal = 0;
   timeInProfiledCallLocal = 0.0;
   worstProfiledCallLocal = 0.0;
   nbInnerLoop = nbOuterLoop = stepSize = inputSize = 0;

   switch( type )
   {
   case PROFILING_10000:
	   nbInnerLoop = 1;
	   nbOuterLoop = 100;
	   stepSize = 10000;
	   inputSize = 10000;
	   break;
   case PROFILING_8000:
	   nbInnerLoop = 2;
	   nbOuterLoop = 50;
	   stepSize = 2000;
	   inputSize = 8000;
       break;
   case PROFILING_5000:
	   nbInnerLoop = 2;
	   nbOuterLoop = 50;
	   stepSize = 5000;
	   inputSize = 5000;
	   break;
   case PROFILING_2000:
	   nbInnerLoop = 5;
	   nbOuterLoop = 20;
	   stepSize = 2000;
	   inputSize = 2000;
	   break;
   case PROFILING_1000:
	   nbInnerLoop = 10;
	   nbOuterLoop = 10;
	   stepSize = 1000;
	   inputSize = 1000;
	   break;
   case PROFILING_500:
	   nbInnerLoop = 20;
	   nbOuterLoop = 5;
	   stepSize = 500;
	   inputSize = 500;
	   break;
   case PROFILING_100:
	   nbInnerLoop = 100;
	   nbOuterLoop = 1;
	   stepSize = 100;
	   inputSize = 100;
	   break;
   }

   retCode = TA_GetFuncHandle( funcName, &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   TA_GetFuncInfo( handle, &funcInfo );

   for( i=0; i < (int)funcInfo->nbOutput; i++ )
   {
      TA_GetOutputParameterInfo( handle, i, &outputInfo );
	  switch(outputInfo->type)
	  {
	  case TA_Output_Real:
	     TA_SetOutputParamRealPtr(paramHolder,i,&output[i][0]);
         for( j=0; j < 2000; j++ )
            output[i][j] = TA_REAL_MIN;
		 break;
	  case TA_Output_Integer:
	     TA_SetOutputParamIntegerPtr(paramHolder,i,&output_int[i][0]);
         for( j=0; j < 2000; j++ )
            output_int[i][j] = TA_INTEGER_MIN;
		 break;
	  }
   }

   for( h=0; h < 2; h++ )
   {
   for( i=0; i < nbOuterLoop; i++ )
   {
	   for( j=0; j < nbInnerLoop; j++ )
	   {
		   /* Prepare input. */
		   for( k=0; k < (int)funcInfo->nbInput; k++ )
		   {
			  TA_GetInputParameterInfo( handle, k, &inputInfo );
			  switch(inputInfo->type)
			  {
			  case TA_Input_Price:
				 TA_SetInputParamPricePtr( paramHolder, k,
					 inputInfo->flags&TA_IN_PRICE_OPEN?&gDataOpen[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_HIGH?&gDataHigh[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_LOW?&gDataLow[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_CLOSE?&gDataClose[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_VOLUME?&gDataClose[j*stepSize]:NULL, NULL );
				 break;
			  case TA_Input_Real:
				 TA_SetInputParamRealPtr( paramHolder, k, &gDataClose[j*stepSize] );
				 break;
			  case TA_Input_Integer:
				 printf( "\nError: Integer input not yet supported for profiling.\n" );
				 return TA_ABS_TST_FAIL_CALLFUNC_1;
			  }
		   }

           #ifdef WIN32
              QueryPerformanceCounter(&startClock);
           #else
              startClock = clock();
           #endif

		   /* Do the function call. */
		   retCode = TA_CallFunc(paramHolder,0,inputSize-1,&outBegIdx,&outNbElement);
		   if( retCode != TA_SUCCESS )
		   {
		      printf( "TA_CallFunc() failed zero data test [%d]\n", retCode );
		      TA_ParamHolderFree( paramHolder );
		      return TA_ABS_TST_FAIL_CALLFUNC_1;
		   }

		   #ifdef WIN32
			   QueryPerformanceCounter(&endClock);
			   clockDelta = (double)((__int64)endClock.QuadPart - (__int64) startClock.QuadPart);
		   #else
			   endClock = clock();
			   clockDelta = (double)(endClock - startClock);
		   #endif

		   /* Setup global profiling info. */
		   if( clockDelta <= 0 )
		   {
			   printf( "Error: Insufficient timer precision to perform benchmarking on this platform.\n" );
			   return TA_ABS_TST_FAIL_CALLFUNC_1;
		   }
		   else
		   {
			   if( clockDelta > worstProfiledCall )
			      worstProfiledCall = clockDelta;
			   timeInProfiledCall += clockDelta;
			   nbProfiledCall++;
		   }

		   /* Setup local profiling info for this particular function. */
		   if( clockDelta > worstProfiledCallLocal )
			   worstProfiledCallLocal = clockDelta;
		   timeInProfiledCallLocal += clockDelta;
		   nbProfiledCallLocal++;
	   }
   }
   }

   /* Output statistic (remove worst call, average the others. */
   printf( "%g ", (timeInProfiledCallLocal-worstProfiledCallLocal)/(double)(nbProfiledCallLocal-1));

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   return TA_TEST_PASS;
}